

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

Aig_Obj_t * Dar_LibBuildBest(Dar_Man_t *p)

{
  int iVar1;
  Dar_Man_t *p_00;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Dar_LibObj_t *pDVar4;
  int local_18;
  int local_14;
  int Counter;
  int i;
  Dar_Man_t *p_local;
  
  local_18 = 4;
  local_14 = 0;
  _Counter = p;
  while( true ) {
    iVar1 = local_14;
    iVar2 = Vec_PtrSize(_Counter->vLeavesBest);
    if (iVar2 <= iVar1) break;
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(_Counter->vLeavesBest,local_14);
    s_DarLib->pDatas[local_14].field_0.pFunc = pAVar3;
    local_14 = local_14 + 1;
  }
  pDVar4 = Dar_LibObj(s_DarLib,_Counter->OutBest);
  Dar_LibBuildClear_rec(pDVar4,&local_18);
  p_00 = _Counter;
  pDVar4 = Dar_LibObj(s_DarLib,_Counter->OutBest);
  pAVar3 = Dar_LibBuildBest_rec(p_00,pDVar4);
  return pAVar3;
}

Assistant:

Aig_Obj_t * Dar_LibBuildBest( Dar_Man_t * p )
{
    int i, Counter = 4;
    for ( i = 0; i < Vec_PtrSize(p->vLeavesBest); i++ )
        s_DarLib->pDatas[i].pFunc = (Aig_Obj_t *)Vec_PtrEntry( p->vLeavesBest, i );
    Dar_LibBuildClear_rec( Dar_LibObj(s_DarLib, p->OutBest), &Counter );
    return Dar_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, p->OutBest) );
}